

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_bootstrap_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::anon_unknown_0::MockGeneratorContext::ExpectFileMatches
          (MockGeneratorContext *this,string *virtual_filename,string *physical_filename)

{
  bool bVar1;
  Message *pMVar2;
  pointer prVar3;
  type pbVar4;
  LogMessage *pLVar5;
  char *pcVar6;
  AlphaNum *in_R8;
  char *in_R9;
  Status *local_268;
  string local_228;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__1;
  Voidify local_1c9;
  AlphaNum local_1c8;
  AlphaNum local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  AlphaNum local_148;
  string local_118;
  undefined1 local_f8 [16];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string actual_contents;
  string expected_contents;
  string local_98;
  AssertHelper local_78;
  Message local_70 [3];
  iterator local_58;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  iterator it;
  string *physical_filename_local;
  string *virtual_filename_local;
  MockGeneratorContext *this_local;
  
  join_0x00000010_0x00000000_ =
       absl::lts_20250127::container_internal::
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
       ::find<std::__cxx11::string>
                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                   *)&this->files_,virtual_filename);
  local_58 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&this->files_);
  local_41 = absl::lts_20250127::container_internal::operator!=
                       ((iterator *)&gtest_ar_.message_,&local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pMVar2 = testing::Message::operator<<
                       (local_70,(char (*) [36])"Generator failed to generate file: ");
    pMVar2 = testing::Message::operator<<(pMVar2,virtual_filename);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_40,(AssertionResult *)"it != files_.end()","false","true"
               ,in_R9);
    in_R8 = (AlphaNum *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
               ,0x3a,(char *)in_R8);
    testing::internal::AssertHelper::operator=(&local_78,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    prVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::iterator::operator->((iterator *)&gtest_ar_.message_);
    pbVar4 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&prVar3->second);
    std::__cxx11::string::string
              ((string *)(actual_contents.field_2._M_local_buf + 8),(string *)pbVar4);
    std::__cxx11::string::string((string *)&absl_log_internal_check_ok_goo.second);
    std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
    pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
              ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_f8 + 8));
    TestSourceDir_abi_cxx11_();
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_148,&local_168);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_198,"/");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1c8,physical_filename);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_118,(lts_20250127 *)&local_148,&local_198,&local_1c8,in_R8);
    File::GetContentsAsText
              ((string *)local_f8,&local_118,(bool)((char)&absl_log_internal_check_ok_goo + '\b'));
    local_f8._8_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_f8);
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_f8._8_8_);
    if (bVar1) {
      local_268 = (Status *)0x0;
    }
    else {
      local_268 = (Status *)
                  absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)local_f8._8_8_,
                             "File::GetContentsAsText( absl::StrCat(TestSourceDir(), \"/\", physical_filename), &actual_contents, true) is OK"
                            );
    }
    absl_log_internal_check_ok_goo.first = local_268;
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_f8._8_8_);
    absl::lts_20250127::Status::~Status((Status *)local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_168);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar6 = absl::lts_20250127::implicit_cast<char_const*>
                         ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&gtest_ar__1.message_,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                 ,0x41,pcVar6);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&gtest_ar__1.message_);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [15])"Unable to get ");
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,physical_filename);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1c9,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&gtest_ar__1.message_);
    }
    local_1f1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&absl_log_internal_check_ok_goo.second,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&actual_contents.field_2 + 8));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pMVar2 = testing::Message::operator<<(&local_200,physical_filename);
      pMVar2 = testing::Message::operator<<
                         (pMVar2,(char (*) [99])
                                 " needs to be regenerated.  Please run generate_descriptor_proto.sh. Then add this file to your CL."
                         );
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_228,(internal *)local_1f0,
                 (AssertionResult *)"actual_contents == expected_contents","false","true",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                 ,0x43,pcVar6);
      testing::internal::AssertHelper::operator=(&local_208,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    std::__cxx11::string::~string((string *)&absl_log_internal_check_ok_goo.second);
    std::__cxx11::string::~string((string *)(actual_contents.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void ExpectFileMatches(const std::string& virtual_filename,
                         const std::string& physical_filename) {
    auto it = files_.find(virtual_filename);
    ASSERT_TRUE(it != files_.end())
      << "Generator failed to generate file: " << virtual_filename;
    std::string expected_contents = *it->second;

    std::string actual_contents;
    ABSL_CHECK_OK(File::GetContentsAsText(
        absl::StrCat(TestSourceDir(), "/", physical_filename), &actual_contents,
        true))
        << "Unable to get " << physical_filename;
    EXPECT_TRUE(actual_contents == expected_contents)
      << physical_filename << " needs to be regenerated.  Please run "
         "generate_descriptor_proto.sh. Then add this file "
         "to your CL.";
  }